

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

bool Rml::Assert(char *msg,char *file,int line)

{
  undefined1 uVar1;
  int iVar2;
  SystemInterface *pSVar3;
  String message;
  String local_28;
  
  CreateString_abi_cxx11_(&local_28,"%s\n%s:%d",msg,file,(ulong)(uint)line);
  pSVar3 = GetSystemInterface();
  if (pSVar3 == (SystemInterface *)0x0) {
    uVar1 = LogDefault::LogMessage(LT_ASSERT,&local_28);
  }
  else {
    iVar2 = (*pSVar3->_vptr_SystemInterface[5])(pSVar3,2,&local_28);
    uVar1 = (undefined1)iVar2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return (bool)uVar1;
}

Assistant:

bool Assert(const char* msg, const char* file, int line)
{
	String message = CreateString("%s\n%s:%d", msg, file, line);

	bool result = true;
	if (SystemInterface* system_interface = GetSystemInterface())
		result = system_interface->LogMessage(Log::LT_ASSERT, message);
	else
		result = LogDefault::LogMessage(Log::LT_ASSERT, message);

	return result;
}